

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool32 __thiscall rw::Image::hasAlpha(Image *this)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  pbVar1 = this->pixels;
  iVar4 = this->depth;
  if (iVar4 == 0x20) {
    if (this->height < 1) {
      bVar2 = 0xff;
    }
    else {
      pbVar1 = pbVar1 + 3;
      bVar2 = 0xff;
      iVar4 = 0;
      do {
        pbVar3 = pbVar1;
        iVar5 = this->width;
        if (0 < this->width) {
          do {
            bVar2 = bVar2 & *pbVar3;
            pbVar3 = pbVar3 + this->bpp;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        iVar4 = iVar4 + 1;
        pbVar1 = pbVar1 + this->stride;
      } while (iVar4 != this->height);
    }
  }
  else {
    if (iVar4 == 0x18) {
      bVar6 = false;
      goto LAB_0010dfcf;
    }
    if (iVar4 == 0x10) {
      if (this->height < 1) {
        bVar6 = true;
      }
      else {
        iVar4 = 0;
        do {
          iVar5 = this->width;
          if (0 < this->width) {
            do {
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != this->height);
        bVar6 = true;
      }
      goto LAB_0010dfcf;
    }
    bVar2 = 0xff;
    if ((iVar4 < 9) && (0 < this->height)) {
      iVar4 = 0;
      do {
        pbVar3 = pbVar1;
        iVar5 = this->width;
        if (0 < this->width) {
          do {
            bVar2 = bVar2 & this->palette[(ulong)*pbVar3 * 4 + 3];
            pbVar3 = pbVar3 + this->bpp;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        pbVar1 = pbVar1 + this->stride;
        iVar4 = iVar4 + 1;
      } while (iVar4 != this->height);
    }
  }
  bVar6 = bVar2 != 0xff;
LAB_0010dfcf:
  return (bool32)bVar6;
}

Assistant:

bool32
Image::hasAlpha(void)
{
	uint8 ret = 0xFF;
	uint8 *pixels = this->pixels;
	if(this->depth == 32){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= line[3];
				line += this->bpp;
			}
			pixels += this->stride;
		}
	}else if(this->depth == 24){
		return 0;
	}else if(this->depth == 16){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= line[1] & 0x80;
				line += this->bpp;
			}
			pixels += this->stride;
		}
		return ret != 0x80;
	}else if(this->depth <= 8){
		for(int y = 0; y < this->height; y++){
			uint8 *line = pixels;
			for(int x = 0; x < this->width; x++){
				ret &= this->palette[*line*4+3];
				line += this->bpp;
			}
			pixels += this->stride;
		}
	}
	return ret != 0xFF;
}